

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  FILE *in_RDI;
  stat64 st;
  int fd;
  allocator *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_f8 [40];
  string *in_stack_ffffffffffffff30;
  size_t local_a8;
  allocator local_31;
  string local_30 [32];
  FILE *local_10;
  size_t local_8;
  
  local_10 = in_RDI;
  if (in_RDI == (FILE *)0x0) {
    in_stack_fffffffffffffef8 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"Failed getting file size. fd is null",in_stack_fffffffffffffef8);
    throw_spdlog_ex(in_stack_ffffffffffffff30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  iVar1 = fileno(local_10);
  iVar1 = fstat64(iVar1,(stat64 *)(local_f8 + 0x20));
  if (iVar1 == 0) {
    local_8 = local_a8;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8,"Failed getting file size from fd",(allocator *)&stack0xffffffffffffff07);
    __errno_location();
    throw_spdlog_ex(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SPDLOG_INLINE size_t filesize(FILE *f)
{
    if (f == nullptr)
    {
        throw_spdlog_ex("Failed getting file size. fd is null");
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = ::_fileno(f);
#if _WIN64 // 64 bits
    __int64 ret = ::_filelengthi64(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }

#else // windows 32 bits
    long ret = ::_filelength(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }
#endif

#else // unix
// OpenBSD doesn't compile with :: before the fileno(..)
#if defined(__OpenBSD__)
    int fd = fileno(f);
#else
    int fd = ::fileno(f);
#endif
// 64 bits(but not in osx or cygwin, where fstat64 is deprecated)
#if (defined(__linux__) || defined(__sun) || defined(_AIX)) && (defined(__LP64__) || defined(_LP64))
    struct stat64 st;
    if (::fstat64(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#else // other unix or linux 32 bits or cygwin
    struct stat st;
    if (::fstat(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#endif
#endif
    throw_spdlog_ex("Failed getting file size from fd", errno);
    return 0; // will not be reached.
}